

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collation.cpp
# Opt level: O2

uint32_t icu_63::Collation::incTwoBytePrimaryByOffset
                   (uint32_t basePrimary,UBool isCompressible,int32_t offset)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  
  bVar3 = isCompressible == '\0';
  iVar2 = (uint)bVar3 * 3 + 0xfb;
  iVar1 = (basePrimary >> 0x10 & 0xff) + (uint)bVar3 * 2 + offset + -4;
  return (iVar1 / iVar2) * 0x1000000 + (basePrimary & 0xff000000) |
         (uint)!bVar3 * 0x20000 + (iVar1 % iVar2) * 0x10000 + 0x20000;
}

Assistant:

uint32_t
Collation::incTwoBytePrimaryByOffset(uint32_t basePrimary, UBool isCompressible, int32_t offset) {
    // Extract the second byte, minus the minimum byte value,
    // plus the offset, modulo the number of usable byte values, plus the minimum.
    // Reserve the PRIMARY_COMPRESSION_LOW_BYTE and high byte if necessary.
    uint32_t primary;
    if(isCompressible) {
        offset += ((int32_t)(basePrimary >> 16) & 0xff) - 4;
        primary = (uint32_t)((offset % 251) + 4) << 16;
        offset /= 251;
    } else {
        offset += ((int32_t)(basePrimary >> 16) & 0xff) - 2;
        primary = (uint32_t)((offset % 254) + 2) << 16;
        offset /= 254;
    }
    // First byte, assume no further overflow.
    return primary | ((basePrimary & 0xff000000) + (uint32_t)(offset << 24));
}